

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitBrOn
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,BrOn *curr)

{
  string_view sVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  Literal *pLVar5;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  Flow flow;
  Literal local_58;
  Literal local_40;
  
  if ((curr->op & ~BrOnNonNull) != BrOnCast) {
    visit((Flow *)&stack0xffffffffffffff58,this,curr->ref);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar5 = Flow::getSingleValue((Flow *)&stack0xffffffffffffff58);
      if (curr->op == BrOnNull) {
        bVar4 = wasm::Type::isNull(&pLVar5->type);
        if (bVar4) {
          sVar2 = (curr->name).super_IString.str._M_len;
          pcVar3 = (curr->name).super_IString.str._M_str;
          *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                            fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar2;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar3;
          goto LAB_00d52fed;
        }
        Literal::Literal(&local_58,pLVar5);
        Flow::Flow(__return_storage_ptr__,&local_58);
        pLVar5 = &local_58;
      }
      else {
        bVar4 = wasm::Type::isNull(&pLVar5->type);
        if (bVar4) {
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                            fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
          goto LAB_00d52fed;
        }
        sVar1 = (curr->name).super_IString.str;
        Literal::Literal(&local_40,pLVar5);
        Flow::Flow(__return_storage_ptr__,(Name)sVar1,&local_40);
        pLVar5 = &local_40;
      }
      Literal::~Literal(pLVar5);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&stack0xffffffffffffff58);
    }
LAB_00d52fed:
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff58);
    return __return_storage_ptr__;
  }
  doCast<wasm::BrOn>((Cast *)&stack0xffffffffffffff58,this,curr);
  if ((char)flow.breakTo.super_IString.str._M_str == '\x02') {
    if (curr->op == BrOnCast) {
      pLVar5 = &local_108;
      Literal::Literal(pLVar5,(Literal *)&stack0xffffffffffffff58);
      Flow::Flow(__return_storage_ptr__,pLVar5);
    }
    else {
      sVar1 = (curr->name).super_IString.str;
      pLVar5 = &local_f0;
      Literal::Literal(pLVar5,(Literal *)&stack0xffffffffffffff58);
      Flow::Flow(__return_storage_ptr__,(Name)sVar1,pLVar5);
    }
  }
  else {
    if ((char)flow.breakTo.super_IString.str._M_str != '\x01') {
      if ((char)flow.breakTo.super_IString.str._M_str != '\0') {
        __assert_fail("result",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x698,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitBrOn(BrOn *) [SubType = wasm::ModuleRunner]"
                     );
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)&stack0xffffffffffffff58);
      goto LAB_00d52f68;
    }
    if (curr->op == BrOnCast) {
      sVar1 = (curr->name).super_IString.str;
      pLVar5 = &local_d8;
      Literal::Literal(pLVar5,(Literal *)&stack0xffffffffffffff58);
      Flow::Flow(__return_storage_ptr__,(Name)sVar1,pLVar5);
    }
    else {
      pLVar5 = &local_c0;
      Literal::Literal(pLVar5,(Literal *)&stack0xffffffffffffff58);
      Flow::Flow(__return_storage_ptr__,pLVar5);
    }
  }
  Literal::~Literal(pLVar5);
LAB_00d52f68:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
  ::~_Variant_storage((_Variant_storage<false,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                       *)&stack0xffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

Flow visitBrOn(BrOn* curr) {
    NOTE_ENTER("BrOn");
    // BrOnCast* uses the casting infrastructure, so handle them first.
    if (curr->op == BrOnCast || curr->op == BrOnCastFail) {
      auto cast = doCast(curr);
      if (auto* breaking = cast.getBreaking()) {
        return *breaking;
      } else if (auto* original = cast.getFailure()) {
        if (curr->op == BrOnCast) {
          return *original;
        } else {
          return Flow(curr->name, *original);
        }
      } else {
        auto* result = cast.getSuccess();
        assert(result);
        if (curr->op == BrOnCast) {
          return Flow(curr->name, *result);
        } else {
          return *result;
        }
      }
    }
    // Otherwise we are just checking for null.
    Flow flow = visit(curr->ref);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    if (curr->op == BrOnNull) {
      // BrOnNull does not propagate the value if it takes the branch.
      if (value.isNull()) {
        return Flow(curr->name);
      }
      // If the branch is not taken, we return the non-null value.
      return {value};
    } else {
      // BrOnNonNull does not return a value if it does not take the branch.
      if (value.isNull()) {
        return Flow();
      }
      // If the branch is taken, we send the non-null value.
      return Flow(curr->name, value);
    }
  }